

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaSampleFormat GetAvailableFormats(snd_pcm_t *pcm)

{
  long lVar1;
  int iVar2;
  int iVar3;
  size_t __n;
  ulong uVar4;
  undefined1 *__s;
  ulong uVar5;
  undefined8 uStack_30;
  
  uStack_30 = 0x110587;
  __n = snd_pcm_hw_params_sizeof();
  lVar1 = -(__n + 0xf & 0xfffffffffffffff0);
  __s = &stack0xffffffffffffffd8 + lVar1;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x1105a5;
  memset(__s,0,__n);
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x1105b0;
  snd_pcm_hw_params_any(pcm,__s);
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x1105c0;
  iVar2 = snd_pcm_hw_params_test_format(pcm,__s,0xe);
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x1105d9;
  iVar3 = snd_pcm_hw_params_test_format(pcm,__s,10);
  uVar4 = (ulong)(-1 < iVar2) + 2;
  if (iVar3 < 0) {
    uVar4 = (ulong)(-1 < iVar2);
  }
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x1105f3;
  iVar2 = snd_pcm_hw_params_test_format(pcm,__s,0x20);
  uVar5 = uVar4 + 4;
  if (iVar2 < 0) {
    uVar5 = uVar4;
  }
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x11060e;
  iVar2 = snd_pcm_hw_params_test_format(pcm,__s,2);
  uVar4 = uVar5 + 8;
  if (iVar2 < 0) {
    uVar4 = uVar5;
  }
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x110628;
  iVar2 = snd_pcm_hw_params_test_format(pcm,__s,1);
  uVar5 = uVar4 | 0x20;
  if (iVar2 < 0) {
    uVar5 = uVar4;
  }
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x110642;
  iVar2 = snd_pcm_hw_params_test_format(pcm,__s,0);
  uVar4 = uVar5 | 0x10;
  if (iVar2 < 0) {
    uVar4 = uVar5;
  }
  return uVar4;
}

Assistant:

static PaSampleFormat GetAvailableFormats( snd_pcm_t *pcm )
{
    PaSampleFormat available = 0;
    snd_pcm_hw_params_t *hwParams;
    alsa_snd_pcm_hw_params_alloca( &hwParams );

    alsa_snd_pcm_hw_params_any( pcm, hwParams );

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT ) >= 0)
        available |= paFloat32;

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S32 ) >= 0)
        available |= paInt32;

#ifdef PA_LITTLE_ENDIAN
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_3LE ) >= 0)
        available |= paInt24;
#elif defined PA_BIG_ENDIAN
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_3BE ) >= 0)
        available |= paInt24;
#endif

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S16 ) >= 0)
        available |= paInt16;

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U8 ) >= 0)
        available |= paUInt8;

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S8 ) >= 0)
        available |= paInt8;

    return available;
}